

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O1

void __thiscall TextReader::parse_quoted(TextReader *this,char quote_symbol)

{
  size_t sVar1;
  ulong uVar2;
  pointer pcVar3;
  size_t sVar4;
  size_t sVar5;
  string local_38;
  
  sVar1 = this->current_token_pos_;
  uVar2 = (this->current_line_)._M_string_length;
  pcVar3 = (this->current_line_)._M_dataplus._M_p;
  sVar4 = this->current_token_len_ + 1;
  do {
    sVar5 = sVar4;
    this->current_token_len_ = sVar5;
    if (uVar2 <= sVar1 + sVar5) goto LAB_0010b94a;
    sVar4 = sVar5 + 1;
  } while (pcVar3[sVar5 + sVar1] != quote_symbol);
  if ((sVar1 + sVar5 < uVar2) &&
     ((this->current_line_)._M_dataplus._M_p[sVar5 + sVar1] == quote_symbol)) {
    this->current_token_len_ = sVar5 + 1;
  }
  else {
LAB_0010b94a:
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"Missing closing quote symbol","");
    parse_error(this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

inline void parse_quoted(const char quote_symbol) {
        current_token_len_++;
        while (current_token_pos_ + current_token_len_ < current_line_.size() &&
            (current_line_[current_token_pos_ + current_token_len_] != quote_symbol)) {
            current_token_len_++;
        };
        if (current_token_pos_ + current_token_len_ < current_line_.size() &&
            (current_line_[current_token_pos_ + current_token_len_] == quote_symbol)) {
            current_token_len_++;
        } else {
            parse_error(ERROR_MISSING_CLOSING_QUOTE);
        };
    }